

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O3

PyObject * pybind11::cpp_function::dispatcher(PyObject *self,PyObject *args_in,PyObject *kwargs_in)

{
  uint __val;
  PyTypeObject *pPVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  handle hVar5;
  pointer phVar6;
  PyTypeObject **ppPVar7;
  bool bVar8;
  byte bVar9;
  uint uVar10;
  int iVar11;
  type_info *find_type;
  long lVar12;
  internals *piVar13;
  handle hVar14;
  undefined8 *puVar15;
  long *plVar16;
  function_call *pfVar17;
  function_record *pfVar18;
  object *poVar19;
  PyObject *pPVar20;
  ushort uVar21;
  ulong uVar22;
  ulong uVar23;
  uint uVar24;
  ulong uVar25;
  instance *piVar26;
  function_record *pfVar27;
  size_type __new_size;
  uint __len;
  function_call *pfVar28;
  uint __uval;
  PyObject *tmp;
  Py_ssize_t *pPVar29;
  ulong uVar30;
  ulong uVar31;
  function_call *pfVar32;
  bool bVar33;
  handle arg;
  tuple extra_args;
  loader_life_support guard_1;
  dict kwargs_1;
  vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
  second_pass;
  dict kwargs;
  instance *pi;
  undefined1 local_1d8 [24];
  object oStack_1c0;
  pointer local_1b8;
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  pointer local_188;
  function_call *local_180;
  instance *local_178;
  function_call *local_170;
  undefined1 local_168 [8];
  undefined1 auStack_160 [16];
  handle hStack_150;
  anon_union_24_2_63b86169_for_instance_1 local_148;
  handle hStack_130;
  pointer local_128;
  handle hStack_120;
  handle local_118;
  handle local_110;
  handle local_108;
  handle local_100;
  undefined1 local_f8 [32];
  handle local_d8;
  long local_d0;
  PyObject local_c8;
  PyObject *local_b8;
  PyTypeObject *local_b0;
  ulong local_a8;
  ulong local_a0;
  void *local_90;
  function_record *local_88;
  pointer phStack_80;
  type_info *local_78;
  PyObject *pPStack_70;
  ulong local_60;
  handle local_58;
  PyTypeObject **local_50;
  handle local_48;
  handle local_40;
  handle local_38;
  
  local_178 = (instance *)PyCapsule_GetPointer(self,0);
  if ((args_in->ob_type->tp_flags & 0x4000000) == 0) {
    __assert_fail("PyTuple_Check(args_in)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/simplestory[P]Vibe/pybind11/include/pybind11/pybind11.h"
                  ,0x1e5,
                  "static PyObject *pybind11::cpp_function::dispatcher(PyObject *, PyObject *, PyObject *)"
                 );
  }
  local_a0 = args_in[1].ob_refcnt;
  if (local_a0 == 0) {
    local_b0 = (PyTypeObject *)0x0;
  }
  else {
    local_b0 = args_in[1].ob_type;
  }
  local_78 = (type_info *)0x0;
  pPStack_70 = (PyObject *)0x0;
  local_88 = (function_record *)0x0;
  phStack_80 = (pointer)0x0;
  if ((*(byte *)((long)&local_178[1].field_1 + 0x11) & 1) != 0) {
    find_type = detail::get_type_info((PyTypeObject *)local_178[2].ob_base.ob_refcnt);
    detail::instance::get_value_and_holder
              ((value_and_holder *)local_168,(instance *)local_b0,find_type,false);
    local_78 = (type_info *)auStack_160._8_8_;
    pPStack_70 = hStack_150.m_ptr;
    local_88 = (function_record *)local_168;
    phStack_80 = (pointer)auStack_160._0_8_;
    if ((type_info *)auStack_160._8_8_ == (type_info *)0x0 || local_168 == (undefined1  [8])0x0) {
      PyErr_SetString(_PyExc_TypeError,"__init__(self, ...) called with invalid `self` argument");
      return (PyObject *)0x0;
    }
    bVar9 = (byte)((PyObject *)((long)local_168 + 0x30))->ob_refcnt;
    if ((bVar9 & 2) == 0) {
      bVar9 = *(byte *)((long)&(((PyObject *)((long)local_168 + 0x10))->ob_type->ob_base).ob_base.
                               ob_refcnt + (long)(PyObject **)auStack_160._0_8_) & 2;
    }
    else {
      bVar9 = bVar9 >> 3 & 1;
    }
    if (bVar9 != 0) {
      __Py_NoneStruct = __Py_NoneStruct + 1;
      local_168 = (undefined1  [8])0x0;
      object::~object((object *)local_168);
      return (PyObject *)&_Py_NoneStruct;
    }
  }
  local_f8._0_8_ = (PyObject *)0x0;
  local_f8._8_8_ = (function_call *)0x0;
  local_f8._16_8_ = (pointer)0x0;
  local_90 = local_178[2].field_1.simple_value_holder[0];
  local_50 = &args_in[1].ob_type;
  local_b8 = (PyObject *)0x1;
  hVar14.m_ptr = &local_178->ob_base;
  local_180 = (function_call *)args_in;
  local_170 = (function_call *)kwargs_in;
  do {
    uVar21 = *(ushort *)((long)&hVar14.m_ptr[5].ob_type + 1);
    uVar24 = (uVar21 & 0x20) >> 5;
    local_60 = (long)(short)((uint)(int)(short)(uVar21 << 9) >> 0xf) +
               ((ulong)*(ushort *)((long)&hVar14.m_ptr[5].ob_type + 4) - (ulong)uVar24);
    uVar22 = local_60 - *(ushort *)((long)&hVar14.m_ptr[5].ob_type + 6);
    if (((uVar24 != 0) || (local_a0 <= uVar22)) &&
       ((local_a8 = uVar22, uVar22 <= local_a0 ||
        (uVar22 <= (ulong)(hVar14.m_ptr[2].ob_refcnt - (long)hVar14.m_ptr[1].ob_type >> 5))))) {
      local_148.simple_value_holder[2] = (function_call *)0x0;
      hStack_130.m_ptr = hStack_130.m_ptr & 0xffffffff00000000;
      local_148.simple_value_holder[1] =
           (void *)((ulong)local_148.simple_value_holder[1] & 0xffffffff00000000);
      hStack_150.m_ptr = (PyObject *)0x0;
      local_148.simple_value_holder[0] = (function_call *)0x0;
      auStack_160._0_8_ = (pointer)0x0;
      auStack_160._8_8_ = (type_info *)0x0;
      local_118.m_ptr = (PyObject *)0x0;
      local_128 = (pointer)0x0;
      hStack_120.m_ptr = (PyObject *)0x0;
      local_110.m_ptr = (PyObject *)local_b0;
      local_108.m_ptr = (PyObject *)0x0;
      local_168 = (undefined1  [8])hVar14.m_ptr;
      std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::reserve
                ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)auStack_160,
                 (ulong)*(ushort *)((long)&hVar14.m_ptr[5].ob_type + 4));
      std::vector<bool,_std::allocator<bool>_>::reserve
                ((vector<bool,_std::allocator<bool>_> *)&local_148.nonsimple,
                 (ulong)*(ushort *)((long)&hVar14.m_ptr[5].ob_type + 4));
      uVar22 = local_a8;
      if (local_a0 < local_a8) {
        uVar22 = local_a0;
      }
      if (((ulong)hVar14.m_ptr[5].ob_type & 0x200) == 0) {
        uVar30 = 0;
      }
      else {
        if ((PyObject *)pPStack_70->ob_refcnt != (PyObject *)0x0) {
          (*local_78->dealloc)((value_and_holder *)&local_88);
        }
        if ((((PyTypeObject *)
             (local_180->args).
             super__Vector_base<pybind11::handle,_std::allocator<pybind11::handle>_>._M_impl.
             super__Vector_impl_data._M_start)->tp_flags & 0x4000000) == 0) {
          __assert_fail("PyTuple_Check(args_in)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/simplestory[P]Vibe/pybind11/include/pybind11/pybind11.h"
                        ,0x232,
                        "static PyObject *pybind11::cpp_function::dispatcher(PyObject *, PyObject *, PyObject *)"
                       );
        }
        local_108.m_ptr =
             (PyObject *)
             (local_180->args).
             super__Vector_base<pybind11::handle,_std::allocator<pybind11::handle>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        local_1d8._0_8_ = (function_call *)&local_88;
        if ((PyObject *)auStack_160._8_8_ == hStack_150.m_ptr) {
          std::vector<pybind11::handle,std::allocator<pybind11::handle>>::
          _M_realloc_insert<_object*>
                    ((vector<pybind11::handle,std::allocator<pybind11::handle>> *)auStack_160,
                     (iterator)auStack_160._8_8_,(_object **)local_1d8);
        }
        else {
          *(PyObject **)auStack_160._8_8_ = (PyObject *)&local_88;
          auStack_160._8_8_ = auStack_160._8_8_ + 8;
        }
        uVar30 = 1;
        std::vector<bool,_std::allocator<bool>_>::push_back
                  ((vector<bool,_std::allocator<bool>_> *)&local_148.nonsimple,false);
      }
      uVar31 = uVar30;
      if (uVar30 < uVar22) {
        uVar25 = (ulong)(uint)((int)uVar30 << 5);
        do {
          pPVar1 = hVar14.m_ptr[1].ob_type;
          if (uVar30 < (ulong)(hVar14.m_ptr[2].ob_refcnt - (long)pPVar1 >> 5)) {
            plVar16 = (long *)((long)&(pPVar1->ob_base).ob_base.ob_refcnt + uVar25);
            bVar33 = pPVar1 != (PyTypeObject *)0x0;
            if ((((local_170 != (function_call *)0x0) && (pPVar1 != (PyTypeObject *)0x0)) &&
                (bVar33 = true, *plVar16 != 0)) &&
               (lVar12 = PyDict_GetItemString(local_170), lVar12 != 0)) {
LAB_0010cfbb:
              bVar33 = false;
              goto LAB_0010d31f;
            }
            if ((((PyTypeObject *)
                 (local_180->args).
                 super__Vector_base<pybind11::handle,_std::allocator<pybind11::handle>_>._M_impl.
                 super__Vector_impl_data._M_start)->tp_flags & 0x4000000) == 0) goto LAB_0010e0b5;
            local_1d8._0_8_ =
                 *(undefined8 *)
                  ((long)&(local_180->args).
                          super__Vector_base<pybind11::handle,_std::allocator<pybind11::handle>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage + uVar30 * 8);
            if (bVar33) {
              bVar33 = true;
              if (((*(byte *)((long)&pPVar1->tp_name + uVar25) & 2) == 0) &&
                 ((function_call *)local_1d8._0_8_ == (function_call *)&_Py_NoneStruct))
              goto LAB_0010cfbb;
            }
            else {
              bVar33 = false;
            }
          }
          else {
            if ((((PyTypeObject *)
                 (local_180->args).
                 super__Vector_base<pybind11::handle,_std::allocator<pybind11::handle>_>._M_impl.
                 super__Vector_impl_data._M_start)->tp_flags & 0x4000000) == 0) {
LAB_0010e0b5:
              __assert_fail("PyTuple_Check(args_in)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/simplestory[P]Vibe/pybind11/include/pybind11/pybind11.h"
                            ,0x241,
                            "static PyObject *pybind11::cpp_function::dispatcher(PyObject *, PyObject *, PyObject *)"
                           );
            }
            local_1d8._0_8_ =
                 *(undefined8 *)
                  ((long)&(local_180->args).
                          super__Vector_base<pybind11::handle,_std::allocator<pybind11::handle>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage + uVar30 * 8);
            bVar33 = false;
            plVar16 = (long *)0x0;
          }
          if ((PyObject *)auStack_160._8_8_ == hStack_150.m_ptr) {
            std::vector<pybind11::handle,std::allocator<pybind11::handle>>::
            _M_realloc_insert<pybind11::handle_const&>
                      ((vector<pybind11::handle,std::allocator<pybind11::handle>> *)auStack_160,
                       (iterator)auStack_160._8_8_,(handle *)local_1d8);
          }
          else {
            *(PyObject **)auStack_160._8_8_ = (PyObject *)local_1d8._0_8_;
            auStack_160._8_8_ = auStack_160._8_8_ + 8;
          }
          bVar9 = 1;
          if (bVar33) {
            bVar9 = *(byte *)(plVar16 + 3);
          }
          std::vector<bool,_std::allocator<bool>_>::push_back
                    ((vector<bool,_std::allocator<bool>_> *)&local_148.nonsimple,(bool)(bVar9 & 1));
          uVar30 = uVar30 + 1;
          uVar25 = uVar25 + 0x20;
          uVar31 = uVar22;
        } while (uVar22 != uVar30);
      }
      local_d8.m_ptr = (PyObject *)local_170;
      if (local_170 != (function_call *)0x0) {
        ((PyObject *)&local_170->func)->ob_refcnt = ((PyObject *)&local_170->func)->ob_refcnt + 1;
      }
      uVar30 = (ulong)*(ushort *)&hVar14.m_ptr[6].ob_refcnt;
      if (uVar31 < uVar30) {
        lVar12 = uVar31 * 0x20;
        local_1d8._0_8_ = *(undefined8 *)((long)&(hVar14.m_ptr[1].ob_type)->ob_base + lVar12 + 0x10)
        ;
        if ((function_call *)local_1d8._0_8_ != (function_call *)0x0) {
          pPVar29 = (Py_ssize_t *)((long)&(hVar14.m_ptr[1].ob_type)->ob_base + lVar12);
          lVar12 = lVar12 + 0x30;
          uVar25 = uVar31;
          do {
            if ((PyObject *)auStack_160._8_8_ == hStack_150.m_ptr) {
              std::vector<pybind11::handle,std::allocator<pybind11::handle>>::
              _M_realloc_insert<pybind11::handle_const&>
                        ((vector<pybind11::handle,std::allocator<pybind11::handle>> *)auStack_160,
                         (iterator)auStack_160._8_8_,(handle *)local_1d8);
            }
            else {
              *(PyObject **)auStack_160._8_8_ = (PyObject *)local_1d8._0_8_;
              auStack_160._8_8_ = auStack_160._8_8_ + 8;
            }
            std::vector<bool,_std::allocator<bool>_>::push_back
                      ((vector<bool,_std::allocator<bool>_> *)&local_148.nonsimple,
                       (bool)((byte)pPVar29[3] & 1));
            uVar31 = uVar25 + 1;
            uVar21 = *(ushort *)&hVar14.m_ptr[6].ob_refcnt;
            uVar30 = (ulong)uVar21;
            uVar23 = (ulong)uVar21;
            if (uVar21 <= uVar31) goto LAB_0010cda5;
            pPVar29 = &(hVar14.m_ptr[1].ob_type)->tp_basicsize + uVar25 * 4;
            local_1d8._0_8_ =
                 *(undefined8 *)
                  ((long)&((hVar14.m_ptr[1].ob_type)->ob_base).ob_base.ob_refcnt + lVar12);
            lVar12 = lVar12 + 0x20;
            uVar25 = uVar31;
          } while ((function_call *)local_1d8._0_8_ != (function_call *)0x0);
        }
        local_1d8._0_8_ = (function_call *)0x0;
        uVar23 = uVar30;
LAB_0010cda5:
        if (uVar23 <= uVar31) goto LAB_0010cdb3;
LAB_0010cef0:
        bVar33 = false;
      }
      else {
LAB_0010cdb3:
        if (uVar31 < local_60) {
          lVar12 = uVar31 << 5;
          bVar33 = false;
          do {
            pPVar1 = hVar14.m_ptr[1].ob_type;
            local_1d8._0_8_ = (function_call *)0x0;
            if (((local_170 == (function_call *)0x0) ||
                (*(long *)((long)&(pPVar1->ob_base).ob_base.ob_refcnt + lVar12) == 0)) ||
               (local_1d8._0_8_ = PyDict_GetItemString(local_d8.m_ptr),
               (function_call *)local_1d8._0_8_ == (function_call *)0x0)) {
              pfVar17 = *(function_call **)((long)&(pPVar1->ob_base).ob_size + lVar12);
              pfVar28 = (function_call *)local_1d8._0_8_;
            }
            else {
              if (!bVar33) {
                local_1a8._0_8_ = PyDict_Copy(local_d8.m_ptr);
                object::operator=((object *)&local_d8,(object *)local_1a8);
                object::~object((object *)local_1a8);
              }
              PyDict_DelItemString
                        (local_d8.m_ptr,
                         *(undefined8 *)((long)&(pPVar1->ob_base).ob_base.ob_refcnt + lVar12));
              bVar33 = true;
              pfVar17 = (function_call *)local_1d8._0_8_;
              pfVar28 = (function_call *)local_1d8._0_8_;
            }
            local_1d8._0_8_ = pfVar17;
            if ((function_call *)local_1d8._0_8_ == (function_call *)0x0) {
              bVar33 = false;
              local_1d8._0_8_ = pfVar28;
              goto LAB_0010d312;
            }
            if ((PyObject *)auStack_160._8_8_ == hStack_150.m_ptr) {
              std::vector<pybind11::handle,std::allocator<pybind11::handle>>::
              _M_realloc_insert<pybind11::handle_const&>
                        ((vector<pybind11::handle,std::allocator<pybind11::handle>> *)auStack_160,
                         (iterator)auStack_160._8_8_,(handle *)local_1d8);
            }
            else {
              ((handle *)auStack_160._8_8_)->m_ptr = (PyObject *)local_1d8._0_8_;
              auStack_160._8_8_ = auStack_160._8_8_ + 8;
            }
            std::vector<bool,_std::allocator<bool>_>::push_back
                      ((vector<bool,_std::allocator<bool>_> *)&local_148.nonsimple,
                       (bool)(*(byte *)((long)&pPVar1->tp_name + lVar12) & 1));
            uVar31 = uVar31 + 1;
            lVar12 = lVar12 + 0x20;
          } while (uVar31 < local_60);
        }
        if ((function_call *)local_d8.m_ptr == (function_call *)0x0) {
          uVar21 = *(ushort *)((long)&hVar14.m_ptr[5].ob_type + 1);
        }
        else {
          lVar12 = PyDict_Size();
          uVar21 = *(ushort *)((long)&hVar14.m_ptr[5].ob_type + 1);
          if ((lVar12 != 0) && ((uVar21 & 0x40) == 0)) goto LAB_0010cef0;
        }
        if ((uVar21 & 0x20) != 0) {
          tuple::tuple((tuple *)local_1a8,0);
          if (uVar22 == 0) {
            local_1d8._0_8_ = local_180;
            ((PyObject *)&local_180->func)->ob_refcnt =
                 ((PyObject *)&local_180->func)->ob_refcnt + 1;
LAB_0010cfe0:
            object::operator=((object *)local_1a8,(object *)local_1d8);
            object::~object((object *)local_1d8);
          }
          else {
            pfVar28 = (function_call *)(local_a0 - uVar31);
            if (local_a0 < uVar31 || pfVar28 == (function_call *)0x0) {
              tuple::tuple((tuple *)local_1d8,0);
              goto LAB_0010cfe0;
            }
            tuple::tuple((tuple *)local_1d8,(size_t)pfVar28);
            object::operator=((object *)local_1a8,(object *)local_1d8);
            object::~object((object *)local_1d8);
            ppPVar7 = local_50;
            pfVar17 = (function_call *)0x0;
            do {
              if ((((PyTypeObject *)
                   (local_180->args).
                   super__Vector_base<pybind11::handle,_std::allocator<pybind11::handle>_>._M_impl.
                   super__Vector_impl_data._M_start)->tp_flags & 0x4000000) == 0) {
                __assert_fail("PyTuple_Check(args_in)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/simplestory[P]Vibe/pybind11/include/pybind11/pybind11.h"
                              ,0x296,
                              "static PyObject *pybind11::cpp_function::dispatcher(PyObject *, PyObject *, PyObject *)"
                             );
              }
              local_1d8._8_8_ = local_1a8._0_8_;
              oStack_1c0.super_handle.m_ptr = (handle)(PyObject *)0x0;
              local_1d8._16_8_ = pfVar17;
              detail::accessor_policies::tuple_item::set
                        ((handle)local_1a8._0_8_,(size_t)pfVar17,
                         (PyObject *)
                         ppPVar7[(long)((long)&((PyObject *)&pfVar17->func)->ob_refcnt + uVar31)]);
              object::~object((object *)(local_1d8 + 0x18));
              pfVar17 = (function_call *)((long)&((PyObject *)&pfVar17->func)->ob_refcnt + 1);
            } while (pfVar28 != pfVar17);
          }
          if ((PyObject *)auStack_160._8_8_ == hStack_150.m_ptr) {
            std::vector<pybind11::handle,std::allocator<pybind11::handle>>::
            _M_realloc_insert<pybind11::handle_const&>
                      ((vector<pybind11::handle,std::allocator<pybind11::handle>> *)auStack_160,
                       (iterator)auStack_160._8_8_,(handle *)local_1a8);
          }
          else {
            *(PyObject **)auStack_160._8_8_ = (PyObject *)local_1a8._0_8_;
            auStack_160._8_8_ = auStack_160._8_8_ + 8;
          }
          std::vector<bool,_std::allocator<bool>_>::push_back
                    ((vector<bool,_std::allocator<bool>_> *)&local_148.nonsimple,false);
          object::operator=((object *)&hStack_120,(object *)local_1a8);
          object::~object((object *)local_1a8);
          uVar21 = *(ushort *)((long)&hVar14.m_ptr[5].ob_type + 1);
        }
        if ((uVar21 & 0x40) != 0) {
          if ((function_call *)local_d8.m_ptr == (function_call *)0x0) {
            dict::dict((dict *)local_1d8);
            object::operator=((object *)&local_d8,(object *)local_1d8);
            object::~object((object *)local_1d8);
          }
          if ((PyObject *)auStack_160._8_8_ == hStack_150.m_ptr) {
            std::vector<pybind11::handle,std::allocator<pybind11::handle>>::
            _M_realloc_insert<pybind11::handle_const&>
                      ((vector<pybind11::handle,std::allocator<pybind11::handle>> *)auStack_160,
                       (iterator)auStack_160._8_8_,&local_d8);
          }
          else {
            *(PyObject **)auStack_160._8_8_ = local_d8.m_ptr;
            auStack_160._8_8_ = auStack_160._8_8_ + 8;
          }
          std::vector<bool,_std::allocator<bool>_>::push_back
                    ((vector<bool,_std::allocator<bool>_> *)&local_148.nonsimple,false);
          object::operator=((object *)&local_118,(object *)&local_d8);
        }
        __new_size = (long)(auStack_160._8_8_ - auStack_160._0_8_) >> 3;
        if ((__new_size != *(ushort *)((long)&hVar14.m_ptr[5].ob_type + 4)) ||
           (((ulong)hStack_130.m_ptr & 0xffffffff) +
            ((long)local_148.simple_value_holder[2] - local_148._0_8_) * 8 != __new_size)) {
          pybind11_fail(
                       "Internal error: function call dispatcher inserted wrong number of arguments!"
                       );
        }
        local_1a8._0_8_ = (PyObject *)0x0;
        local_1a8._8_8_ = local_1a8._8_8_ & 0xffffffff00000000;
        local_198._0_8_ = (function_record *)0x0;
        local_198._8_8_ = local_198._8_8_ & 0xffffffff00000000;
        local_188 = (pointer)0x0;
        if (local_90 != (void *)0x0) {
          std::vector<bool,_std::allocator<bool>_>::resize
                    ((vector<bool,_std::allocator<bool>_> *)local_1a8,__new_size,false);
          phVar6 = local_128;
          hVar5.m_ptr = hStack_130.m_ptr;
          uVar4 = local_148.simple_value_holder[2];
          uVar3 = local_148.simple_value_holder[1];
          uVar2 = local_148.simple_value_holder[0];
          local_1b8 = local_128;
          local_1d8._16_8_ = local_148.simple_value_holder[2];
          oStack_1c0.super_handle.m_ptr = (handle)(handle)hStack_130.m_ptr;
          local_1d8._0_8_ = local_148.simple_value_holder[0];
          local_1d8._8_8_ = local_148.simple_value_holder[1];
          local_128 = local_188;
          local_148.simple_value_holder[2] = (void *)local_198._0_8_;
          hStack_130.m_ptr = (PyObject *)local_198._8_8_;
          local_148.simple_value_holder[0] = (void *)local_1a8._0_8_;
          local_148.simple_value_holder[1] = (void *)local_1a8._8_8_;
          local_188 = phVar6;
          local_198._0_8_ = uVar4;
          local_198._8_8_ = hVar5.m_ptr;
          local_1a8._0_8_ = uVar2;
          local_1a8._8_8_ = uVar3;
        }
        piVar13 = detail::get_internals();
        local_40.m_ptr = (PyObject *)0x0;
        std::vector<_object*,std::allocator<_object*>>::emplace_back<_object*>
                  ((vector<_object*,std::allocator<_object*>> *)&piVar13->loader_patient_stack,
                   &local_40.m_ptr);
        local_b8 = (PyObject *)(*(code *)hVar14.m_ptr[3].ob_refcnt)(local_168);
        detail::loader_life_support::~loader_life_support((loader_life_support *)local_1d8);
        phVar6 = local_128;
        hVar5.m_ptr = hStack_130.m_ptr;
        uVar4 = local_148.simple_value_holder[2];
        uVar3 = local_148.simple_value_holder[1];
        uVar2 = local_148.simple_value_holder[0];
        bVar33 = local_b8 != (PyObject *)0x1;
        if (local_90 != (void *)0x0 && !bVar33) {
          for (uVar22 = (ulong)(*(ushort *)((long)&hVar14.m_ptr[5].ob_type + 1) >> 4 & 1);
              uVar22 < local_a8; uVar22 = uVar22 + 1) {
            uVar30 = uVar22 + 0x3f;
            if (-1 < (long)uVar22) {
              uVar30 = uVar22;
            }
            if ((*(ulong *)(local_1a8._0_8_ +
                           (ulong)((uVar22 & 0x800000000000003f) < 0x8000000000000001) * 8 +
                           ((long)uVar30 >> 6) * 8 + -8) >> (uVar22 & 0x3f) & 1) != 0) {
              local_1b8 = local_128;
              local_1d8._16_8_ = local_148.simple_value_holder[2];
              oStack_1c0.super_handle.m_ptr = (handle)(handle)hStack_130.m_ptr;
              local_1d8._0_8_ = local_148.simple_value_holder[0];
              local_1d8._8_8_ = local_148.simple_value_holder[1];
              local_128 = local_188;
              local_148.simple_value_holder[2] = (void *)local_198._0_8_;
              hStack_130.m_ptr = (PyObject *)local_198._8_8_;
              local_148.simple_value_holder[0] = (void *)local_1a8._0_8_;
              local_148.simple_value_holder[1] = (void *)local_1a8._8_8_;
              local_188 = phVar6;
              local_198._0_8_ = uVar4;
              local_198._8_8_ = hVar5.m_ptr;
              local_1a8._0_8_ = uVar2;
              local_1a8._8_8_ = uVar3;
              std::
              vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
              ::emplace_back<pybind11::detail::function_call>
                        ((vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
                          *)local_f8,(function_call *)local_168);
              break;
            }
          }
          bVar33 = false;
        }
        if ((function_call *)local_1a8._0_8_ != (function_call *)0x0) {
          operator_delete((void *)local_1a8._0_8_,(long)local_188 - local_1a8._0_8_);
        }
      }
LAB_0010d312:
      object::~object((object *)&local_d8);
LAB_0010d31f:
      object::~object((object *)&local_118);
      object::~object((object *)&hStack_120);
      if ((function_call *)local_148.simple_value_holder[0] != (function_call *)0x0) {
        operator_delete(local_148.simple_value_holder[0],(long)local_128 - local_148._0_8_);
        local_148.simple_value_holder[0] = (function_call *)0x0;
        local_148.simple_value_holder[1] =
             (void *)((ulong)local_148.simple_value_holder[1] & 0xffffffff00000000);
        local_148.simple_value_holder[2] = (function_call *)0x0;
        hStack_130.m_ptr = hStack_130.m_ptr & 0xffffffff00000000;
        local_128 = (pointer)0x0;
      }
      if ((pointer)auStack_160._0_8_ != (pointer)0x0) {
        operator_delete((void *)auStack_160._0_8_,(long)hStack_150.m_ptr - auStack_160._0_8_);
      }
      if (bVar33) break;
    }
    hVar14.m_ptr = (PyObject *)hVar14.m_ptr[8].ob_refcnt;
  } while ((instance *)hVar14.m_ptr != (instance *)0x0);
  hVar14.m_ptr = local_b8;
  uVar2 = local_f8._8_8_;
  if ((local_90 == (void *)0x0) || (local_f8._0_8_ == local_f8._8_8_)) {
    std::vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>::
    ~vector((vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
             *)local_f8);
    if (hVar14.m_ptr != (PyObject *)0x1) goto LAB_0010d45a;
  }
  else {
    if (local_b8 != (PyObject *)0x1) {
LAB_0010d434:
      std::vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
      ::~vector((vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
                 *)local_f8);
LAB_0010d45a:
      if (hVar14.m_ptr != (PyObject *)0x0) {
        if ((*(byte *)((long)&local_178[1].field_1 + 0x11) & 1) == 0) {
          return hVar14.m_ptr;
        }
        if ((*(byte *)&local_88->impl & 2) == 0) {
          bVar9 = *(byte *)((long)&phStack_80->m_ptr +
                           *(long *)&(local_88->args).
                                     super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                                     ._M_impl.super__Vector_impl_data);
        }
        else {
          bVar9 = *(byte *)&local_88->impl >> 2;
        }
        if ((bVar9 & 1) == 0) {
          (*local_78->init_instance)((instance *)local_b0,(void *)0x0);
          return hVar14.m_ptr;
        }
        return hVar14.m_ptr;
      }
      local_168 = (undefined1  [8])(auStack_160 + 8);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_168,
                 "Unable to convert function return value to a Python type! The signature was\n\t",
                 "");
      std::__cxx11::string::append(local_168);
      lVar12 = std::__cxx11::string::find(local_168,0x117e9d,0);
      if (lVar12 != -1) {
        std::__cxx11::string::append(local_168);
      }
      PyErr_SetString(_PyExc_TypeError,local_168);
      if (local_168 == (undefined1  [8])(auStack_160 + 8)) {
        return (PyObject *)0x0;
      }
      goto LAB_0010e08d;
    }
    pfVar28 = (function_call *)local_f8._0_8_;
    do {
      piVar13 = detail::get_internals();
      local_38.m_ptr = (PyObject *)0x0;
      std::vector<_object*,std::allocator<_object*>>::emplace_back<_object*>
                ((vector<_object*,std::allocator<_object*>> *)&piVar13->loader_patient_stack,
                 &local_38.m_ptr);
      hVar14 = (*pfVar28->func->impl)(pfVar28);
      detail::loader_life_support::~loader_life_support((loader_life_support *)local_168);
      if (hVar14.m_ptr != (PyObject *)0x1) goto LAB_0010d434;
      pfVar28 = pfVar28 + 1;
    } while (pfVar28 != (function_call *)uVar2);
    std::vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>::
    ~vector((vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
             *)local_f8);
  }
  if ((*(byte *)((long)&local_178[1].field_1 + 0x11) & 8) != 0) {
    __Py_NotImplementedStruct = __Py_NotImplementedStruct + 1;
    return (PyObject *)&_Py_NotImplementedStruct;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_f8,(char *)(local_178->ob_base).ob_refcnt,(allocator<char> *)&local_100
            );
  puVar15 = (undefined8 *)std::__cxx11::string::append(local_f8);
  local_1a8._0_8_ = local_198;
  pfVar28 = (function_call *)(puVar15 + 2);
  if ((function_call *)*puVar15 == pfVar28) {
    local_198._0_8_ = ((PyObject *)&pfVar28->func)->ob_refcnt;
    local_198._8_8_ = puVar15[3];
  }
  else {
    local_198._0_8_ = ((PyObject *)&pfVar28->func)->ob_refcnt;
    local_1a8._0_8_ = (PyObject *)*puVar15;
  }
  local_1a8._8_8_ = puVar15[1];
  *puVar15 = pfVar28;
  puVar15[1] = 0;
  *(undefined1 *)(puVar15 + 2) = 0;
  uVar21 = *(ushort *)((long)&local_178[1].field_1 + 0x11);
  iVar11 = 0x117beb;
  if ((uVar21 & 1) != 0) {
    iVar11 = 0x117bdf;
  }
  local_d8.m_ptr = &local_c8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d8,iVar11,iVar11 + (uVar21 & 1) * 3 + 8);
  pfVar27 = (function_record *)((long)&((PyObject *)local_1a8._8_8_)->ob_refcnt + local_d0);
  pfVar18 = (function_record *)0xf;
  if ((function_call *)local_1a8._0_8_ != (function_call *)local_198) {
    pfVar18 = (function_record *)local_198._0_8_;
  }
  if (pfVar18 < pfVar27) {
    pfVar18 = (function_record *)0xf;
    if (local_d8.m_ptr != &local_c8) {
      pfVar18 = (function_record *)local_c8.ob_refcnt;
    }
    if (pfVar18 < pfVar27) goto LAB_0010d713;
    puVar15 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_d8,0,(char *)0x0,local_1a8._0_8_);
  }
  else {
LAB_0010d713:
    puVar15 = (undefined8 *)std::__cxx11::string::_M_append(local_1a8,(ulong)local_d8.m_ptr);
  }
  local_1d8._0_8_ = local_1d8 + 0x10;
  pfVar28 = (function_call *)(puVar15 + 2);
  if ((function_call *)*puVar15 == pfVar28) {
    local_1d8._16_8_ = ((PyObject *)&pfVar28->func)->ob_refcnt;
    oStack_1c0.super_handle.m_ptr = (handle)puVar15[3];
  }
  else {
    local_1d8._16_8_ = ((PyObject *)&pfVar28->func)->ob_refcnt;
    local_1d8._0_8_ = (function_call *)*puVar15;
  }
  local_1d8._8_8_ = puVar15[1];
  *puVar15 = pfVar28;
  puVar15[1] = 0;
  *(undefined1 *)&((PyObject *)&pfVar28->func)->ob_refcnt = 0;
  plVar16 = (long *)std::__cxx11::string::append(local_1d8);
  local_168 = (undefined1  [8])(auStack_160 + 8);
  piVar26 = (instance *)(plVar16 + 2);
  if ((instance *)*plVar16 == piVar26) {
    auStack_160._8_8_ = (piVar26->ob_base).ob_refcnt;
    hStack_150.m_ptr = (PyObject *)plVar16[3];
  }
  else {
    auStack_160._8_8_ = (piVar26->ob_base).ob_refcnt;
    local_168 = (undefined1  [8])*plVar16;
  }
  auStack_160._0_8_ = plVar16[1];
  *plVar16 = (long)piVar26;
  plVar16[1] = 0;
  *(undefined1 *)(plVar16 + 2) = 0;
  if ((function_call *)local_1d8._0_8_ != (function_call *)(local_1d8 + 0x10)) {
    operator_delete((void *)local_1d8._0_8_,(ulong)(local_1d8._16_8_ + 1));
  }
  if (local_d8.m_ptr != &local_c8) {
    operator_delete(local_d8.m_ptr,(ulong)((long)&((PyObject *)local_c8.ob_refcnt)->ob_refcnt + 1));
  }
  if ((function_call *)local_1a8._0_8_ != (function_call *)local_198) {
    operator_delete((void *)local_1a8._0_8_,(ulong)(local_198._0_8_ + 1));
  }
  if ((function_call *)local_f8._0_8_ != (function_call *)(local_f8 + 0x10)) {
    operator_delete((void *)local_f8._0_8_,(ulong)((long)(function_record **)local_f8._16_8_ + 1));
  }
  piVar26 = local_178;
  uVar24 = 0;
  do {
    __val = uVar24 + 1;
    __len = 1;
    if (8 < uVar24) {
      uVar22 = (ulong)__val;
      uVar24 = 4;
      do {
        __len = uVar24;
        uVar10 = (uint)uVar22;
        if (uVar10 < 100) {
          __len = __len - 2;
          goto LAB_0010d8b7;
        }
        if (uVar10 < 1000) {
          __len = __len - 1;
          goto LAB_0010d8b7;
        }
        if (uVar10 < 10000) goto LAB_0010d8b7;
        uVar22 = uVar22 / 10000;
        uVar24 = __len + 4;
      } while (99999 < uVar10);
      __len = __len + 1;
    }
LAB_0010d8b7:
    local_f8._0_8_ = local_f8 + 0x10;
    std::__cxx11::string::_M_construct((ulong)local_f8,(char)__len);
    std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_f8._0_8_,__len,__val);
    puVar15 = (undefined8 *)std::__cxx11::string::replace((ulong)local_f8,0,(char *)0x0,0x117c2d);
    local_1a8._0_8_ = local_198;
    pfVar28 = (function_call *)(puVar15 + 2);
    if ((function_call *)*puVar15 == pfVar28) {
      local_198._0_8_ = ((PyObject *)&pfVar28->func)->ob_refcnt;
      local_198._8_8_ = puVar15[3];
    }
    else {
      local_198._0_8_ = ((PyObject *)&pfVar28->func)->ob_refcnt;
      local_1a8._0_8_ = (PyObject *)*puVar15;
    }
    local_1a8._8_8_ = puVar15[1];
    *puVar15 = pfVar28;
    puVar15[1] = 0;
    *(undefined1 *)(puVar15 + 2) = 0;
    puVar15 = (undefined8 *)std::__cxx11::string::append(local_1a8);
    local_1d8._0_8_ = local_1d8 + 0x10;
    pfVar28 = (function_call *)(puVar15 + 2);
    if ((function_call *)*puVar15 == pfVar28) {
      local_1d8._16_8_ = ((PyObject *)&pfVar28->func)->ob_refcnt;
      oStack_1c0.super_handle.m_ptr = (handle)puVar15[3];
    }
    else {
      local_1d8._16_8_ = ((PyObject *)&pfVar28->func)->ob_refcnt;
      local_1d8._0_8_ = (function_call *)*puVar15;
    }
    local_1d8._8_8_ = puVar15[1];
    *puVar15 = pfVar28;
    puVar15[1] = 0;
    *(undefined1 *)(puVar15 + 2) = 0;
    std::__cxx11::string::_M_append((char *)local_168,local_1d8._0_8_);
    if ((function_call *)local_1d8._0_8_ != (function_call *)(local_1d8 + 0x10)) {
      operator_delete((void *)local_1d8._0_8_,(ulong)(local_1d8._16_8_ + 1));
    }
    if ((function_call *)local_1a8._0_8_ != (function_call *)local_198) {
      operator_delete((void *)local_1a8._0_8_,(ulong)(local_198._0_8_ + 1));
    }
    if ((function_call *)local_f8._0_8_ != (function_call *)(local_f8 + 0x10)) {
      operator_delete((void *)local_f8._0_8_,(ulong)((long)(function_record **)local_f8._16_8_ + 1))
      ;
    }
    if ((*(byte *)((long)&local_178[1].field_1 + 0x11) & 1) == 0) {
LAB_0010db44:
      std::__cxx11::string::append((char *)local_168);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1d8,(char *)(piVar26->field_1).simple_value_holder[0],
                 (allocator<char> *)local_1a8);
      lVar12 = std::__cxx11::string::find((char)(string *)local_1d8,0x28);
      pfVar28 = (function_call *)(lVar12 + 7);
      if ((ulong)local_1d8._8_8_ <= pfVar28) {
LAB_0010db28:
        if ((function_call *)local_1d8._0_8_ != (function_call *)(local_1d8 + 0x10)) {
          operator_delete((void *)local_1d8._0_8_,(ulong)(local_1d8._16_8_ + 1));
        }
        goto LAB_0010db44;
      }
      pfVar17 = (function_call *)std::__cxx11::string::find(local_1d8,0x1177be,0);
      std::__cxx11::string::rfind(local_1d8,0x117c32,0xffffffffffffffff);
      if (pfVar17 < (ulong)local_1d8._8_8_) {
        pfVar32 = (function_call *)((long)&((PyObject *)&pfVar17->func)->ob_refcnt + 2);
      }
      else {
        pfVar17 = (function_call *)std::__cxx11::string::find((char)local_1d8,0x29);
        pfVar32 = pfVar17;
      }
      if ((pfVar17 <= pfVar28) || ((ulong)local_1d8._8_8_ <= pfVar32)) goto LAB_0010db28;
      std::__cxx11::string::append((string *)local_168,(ulong)local_1d8,(ulong)pfVar28);
      std::__cxx11::string::push_back((char)(string *)local_168);
      std::__cxx11::string::append((string *)local_168,(ulong)local_1d8,(ulong)pfVar32);
      if ((function_call *)local_1d8._0_8_ != (function_call *)(local_1d8 + 0x10)) {
        operator_delete((void *)local_1d8._0_8_,(ulong)(local_1d8._16_8_ + 1));
      }
    }
    std::__cxx11::string::append((char *)local_168);
    piVar26 = (instance *)piVar26[2].field_1.simple_value_holder[0];
    uVar24 = __val;
  } while (piVar26 != (instance *)0x0);
  std::__cxx11::string::append(local_168);
  local_d8.m_ptr = (PyObject *)local_180;
  if (local_180 != (function_call *)0x0) {
    ((PyObject *)&local_180->func)->ob_refcnt = ((PyObject *)&local_180->func)->ob_refcnt + 1;
  }
  bVar33 = false;
  for (pfVar27 = (function_record *)(ulong)(*(ushort *)((long)&local_178[1].field_1 + 0x11) & 1);
      pfVar18 = (function_record *)PyTuple_Size(local_d8.m_ptr), pfVar27 < pfVar18;
      pfVar27 = (function_record *)((long)&((PyObject *)&pfVar27->name)->ob_refcnt + 1)) {
    bVar8 = true;
    if (bVar33) {
      std::__cxx11::string::append(local_168);
      bVar8 = bVar33;
    }
    bVar33 = bVar8;
    local_1a8._8_8_ = local_d8.m_ptr;
    local_198._8_8_ = (PyObject *)0x0;
    local_198._0_8_ = pfVar27;
    poVar19 = detail::accessor<pybind11::detail::accessor_policies::tuple_item>::get_cache
                        ((accessor<pybind11::detail::accessor_policies::tuple_item> *)local_1a8);
    local_100.m_ptr = (poVar19->super_handle).m_ptr;
    if ((function_call *)local_100.m_ptr != (function_call *)0x0) {
      ((PyObject *)&(local_100.m_ptr)->ob_refcnt)->ob_refcnt =
           ((PyObject *)&(local_100.m_ptr)->ob_refcnt)->ob_refcnt + 1;
    }
    hVar14.m_ptr = (PyObject *)PyObject_Repr(local_100.m_ptr);
    if ((function_call *)hVar14.m_ptr == (function_call *)0x0) {
      local_180 = (function_call *)__cxa_allocate_exception(0x28);
      error_already_set::error_already_set((error_already_set *)local_180);
      __cxa_throw(local_180,&error_already_set::typeinfo,error_already_set::~error_already_set);
    }
    local_f8._0_8_ = hVar14.m_ptr;
    str::operator_cast_to_string((string *)local_1d8,(str *)local_f8);
    std::__cxx11::string::_M_append(local_168,local_1d8._0_8_);
    if ((function_call *)local_1d8._0_8_ != (function_call *)(local_1d8 + 0x10)) {
      operator_delete((void *)local_1d8._0_8_,(ulong)(local_1d8._16_8_ + 1));
    }
    object::~object((object *)local_f8);
    object::~object((object *)&local_100);
    object::~object((object *)(local_198 + 8));
  }
  if (local_170 != (function_call *)0x0) {
    local_100.m_ptr = (PyObject *)local_170;
    ((PyObject *)&local_170->func)->ob_refcnt = ((PyObject *)&local_170->func)->ob_refcnt + 1;
    lVar12 = PyDict_Size();
    if (lVar12 != 0) {
      if (bVar33) {
        std::__cxx11::string::append(local_168);
      }
      std::__cxx11::string::append(local_168);
      local_1d8._0_8_ = local_100.m_ptr;
      local_1d8._8_8_ = (function_call *)0x0;
      local_1d8._16_8_ = (function_call *)0x0;
      oStack_1c0.super_handle.m_ptr = (handle)(PyObject *)0x0;
      iVar11 = PyDict_Next(local_100.m_ptr,local_1d8 + 0x18,local_1d8 + 8,local_1d8 + 0x10);
      if ((iVar11 != 0) && (oStack_1c0.super_handle.m_ptr != (PyObject *)0xffffffffffffffff)) {
        local_f8._0_8_ = local_1d8._8_8_;
        local_f8._8_8_ = local_1d8._16_8_;
        while( true ) {
          str::str((str *)&local_48,"{}=");
          str::format<pybind11::handle&>((str *)&local_58,&local_48);
          str::operator_cast_to_string((string *)local_1a8,(str *)&local_58);
          std::__cxx11::string::_M_append(local_168,local_1a8._0_8_);
          if ((PyObject *)local_1a8._0_8_ != (PyObject *)local_198) {
            operator_delete((void *)local_1a8._0_8_,(ulong)(local_198._0_8_ + 1));
          }
          object::~object((object *)&local_58);
          object::~object((object *)&local_48);
          pPVar20 = (PyObject *)PyObject_Repr(local_f8._8_8_);
          if (pPVar20 == (PyObject *)0x0) {
            local_170 = (function_call *)__cxa_allocate_exception(0x28);
            error_already_set::error_already_set((error_already_set *)local_170);
            __cxa_throw(local_170,&error_already_set::typeinfo,error_already_set::~error_already_set
                       );
          }
          local_58.m_ptr = pPVar20;
          str::operator_cast_to_string((string *)local_1a8,(str *)&local_58);
          std::__cxx11::string::_M_append(local_168,local_1a8._0_8_);
          if ((PyObject *)local_1a8._0_8_ != (PyObject *)local_198) {
            operator_delete((void *)local_1a8._0_8_,(ulong)(local_198._0_8_ + 1));
          }
          object::~object((object *)&local_58);
          iVar11 = PyDict_Next(local_1d8._0_8_,local_1d8 + 0x18,local_1d8 + 8,local_1d8 + 0x10);
          if ((iVar11 == 0) || (oStack_1c0.super_handle.m_ptr == (PyObject *)0xffffffffffffffff))
          break;
          local_f8._0_8_ = local_1d8._8_8_;
          local_f8._8_8_ = local_1d8._16_8_;
          std::__cxx11::string::append(local_168);
        }
      }
    }
    object::~object((object *)&local_100);
  }
  lVar12 = std::__cxx11::string::find(local_168,0x117e9d,0);
  if (lVar12 != -1) {
    std::__cxx11::string::append(local_168);
  }
  PyErr_SetString(_PyExc_TypeError,local_168);
  object::~object((object *)&local_d8);
  if (local_168 == (undefined1  [8])(auStack_160 + 8)) {
    return (PyObject *)0x0;
  }
LAB_0010e08d:
  operator_delete((void *)local_168,(ulong)((long)(PyTypeObject **)auStack_160._8_8_ + 1));
  return (PyObject *)0x0;
}

Assistant:

static PyObject *dispatcher(PyObject *self, PyObject *args_in, PyObject *kwargs_in) {
        using namespace detail;

        /* Iterator over the list of potentially admissible overloads */
        const function_record *overloads = (function_record *) PyCapsule_GetPointer(self, nullptr),
                              *it = overloads;

        /* Need to know how many arguments + keyword arguments there are to pick the right overload */
        const auto n_args_in = (size_t) PyTuple_GET_SIZE(args_in);

        handle parent = n_args_in > 0 ? PyTuple_GET_ITEM(args_in, 0) : nullptr,
               result = PYBIND11_TRY_NEXT_OVERLOAD;

        auto self_value_and_holder = value_and_holder();
        if (overloads->is_constructor) {
            const auto tinfo = get_type_info((PyTypeObject *) overloads->scope.ptr());
            const auto pi = reinterpret_cast<instance *>(parent.ptr());
            self_value_and_holder = pi->get_value_and_holder(tinfo, false);

            if (!self_value_and_holder.type || !self_value_and_holder.inst) {
                PyErr_SetString(PyExc_TypeError, "__init__(self, ...) called with invalid `self` argument");
                return nullptr;
            }

            // If this value is already registered it must mean __init__ is invoked multiple times;
            // we really can't support that in C++, so just ignore the second __init__.
            if (self_value_and_holder.instance_registered())
                return none().release().ptr();
        }

        try {
            // We do this in two passes: in the first pass, we load arguments with `convert=false`;
            // in the second, we allow conversion (except for arguments with an explicit
            // py::arg().noconvert()).  This lets us prefer calls without conversion, with
            // conversion as a fallback.
            std::vector<function_call> second_pass;

            // However, if there are no overloads, we can just skip the no-convert pass entirely
            const bool overloaded = it != nullptr && it->next != nullptr;

            for (; it != nullptr; it = it->next) {

                /* For each overload:
                   1. Copy all positional arguments we were given, also checking to make sure that
                      named positional arguments weren't *also* specified via kwarg.
                   2. If we weren't given enough, try to make up the omitted ones by checking
                      whether they were provided by a kwarg matching the `py::arg("name")` name.  If
                      so, use it (and remove it from kwargs; if not, see if the function binding
                      provided a default that we can use.
                   3. Ensure that either all keyword arguments were "consumed", or that the function
                      takes a kwargs argument to accept unconsumed kwargs.
                   4. Any positional arguments still left get put into a tuple (for args), and any
                      leftover kwargs get put into a dict.
                   5. Pack everything into a vector; if we have py::args or py::kwargs, they are an
                      extra tuple or dict at the end of the positional arguments.
                   6. Call the function call dispatcher (function_record::impl)

                   If one of these fail, move on to the next overload and keep trying until we get a
                   result other than PYBIND11_TRY_NEXT_OVERLOAD.
                 */

                const function_record &func = *it;
                size_t num_args = func.nargs;    // Number of positional arguments that we need
                if (func.has_args) --num_args;   // (but don't count py::args
                if (func.has_kwargs) --num_args; //  or py::kwargs)
                size_t pos_args = num_args - func.nargs_kw_only;

                if (!func.has_args && n_args_in > pos_args)
                    continue; // Too many positional arguments for this overload

                if (n_args_in < pos_args && func.args.size() < pos_args)
                    continue; // Not enough positional arguments given, and not enough defaults to fill in the blanks

                function_call call(func, parent);

                size_t args_to_copy = (std::min)(pos_args, n_args_in); // Protect std::min with parentheses
                size_t args_copied = 0;

                // 0. Inject new-style `self` argument
                if (func.is_new_style_constructor) {
                    // The `value` may have been preallocated by an old-style `__init__`
                    // if it was a preceding candidate for overload resolution.
                    if (self_value_and_holder)
                        self_value_and_holder.type->dealloc(self_value_and_holder);

                    call.init_self = PyTuple_GET_ITEM(args_in, 0);
                    call.args.emplace_back(reinterpret_cast<PyObject *>(&self_value_and_holder));
                    call.args_convert.push_back(false);
                    ++args_copied;
                }

                // 1. Copy any position arguments given.
                bool bad_arg = false;
                for (; args_copied < args_to_copy; ++args_copied) {
                    const argument_record *arg_rec = args_copied < func.args.size() ? &func.args[args_copied] : nullptr;
                    if (kwargs_in && arg_rec && arg_rec->name && PyDict_GetItemString(kwargs_in, arg_rec->name)) {
                        bad_arg = true;
                        break;
                    }

                    handle arg(PyTuple_GET_ITEM(args_in, args_copied));
                    if (arg_rec && !arg_rec->none && arg.is_none()) {
                        bad_arg = true;
                        break;
                    }
                    call.args.push_back(arg);
                    call.args_convert.push_back(arg_rec ? arg_rec->convert : true);
                }
                if (bad_arg)
                    continue; // Maybe it was meant for another overload (issue #688)

                // We'll need to copy this if we steal some kwargs for defaults
                dict kwargs = reinterpret_borrow<dict>(kwargs_in);

                // 1.5. Fill in any missing pos_only args from defaults if they exist
                if (args_copied < func.nargs_pos_only) {
                    for (; args_copied < func.nargs_pos_only; ++args_copied) {
                        const auto &arg = func.args[args_copied];
                        handle value;

                        if (arg.value) {
                            value = arg.value;
                        }
                        if (value) {
                            call.args.push_back(value);
                            call.args_convert.push_back(arg.convert);
                        } else
                            break;
                    }

                    if (args_copied < func.nargs_pos_only)
                        continue; // Not enough defaults to fill the positional arguments
                }

                // 2. Check kwargs and, failing that, defaults that may help complete the list
                if (args_copied < num_args) {
                    bool copied_kwargs = false;

                    for (; args_copied < num_args; ++args_copied) {
                        const auto &arg = func.args[args_copied];

                        handle value;
                        if (kwargs_in && arg.name)
                            value = PyDict_GetItemString(kwargs.ptr(), arg.name);

                        if (value) {
                            // Consume a kwargs value
                            if (!copied_kwargs) {
                                kwargs = reinterpret_steal<dict>(PyDict_Copy(kwargs.ptr()));
                                copied_kwargs = true;
                            }
                            PyDict_DelItemString(kwargs.ptr(), arg.name);
                        } else if (arg.value) {
                            value = arg.value;
                        }

                        if (value) {
                            call.args.push_back(value);
                            call.args_convert.push_back(arg.convert);
                        }
                        else
                            break;
                    }

                    if (args_copied < num_args)
                        continue; // Not enough arguments, defaults, or kwargs to fill the positional arguments
                }

                // 3. Check everything was consumed (unless we have a kwargs arg)
                if (kwargs && !kwargs.empty() && !func.has_kwargs)
                    continue; // Unconsumed kwargs, but no py::kwargs argument to accept them

                // 4a. If we have a py::args argument, create a new tuple with leftovers
                if (func.has_args) {
                    tuple extra_args;
                    if (args_to_copy == 0) {
                        // We didn't copy out any position arguments from the args_in tuple, so we
                        // can reuse it directly without copying:
                        extra_args = reinterpret_borrow<tuple>(args_in);
                    } else if (args_copied >= n_args_in) {
                        extra_args = tuple(0);
                    } else {
                        size_t args_size = n_args_in - args_copied;
                        extra_args = tuple(args_size);
                        for (size_t i = 0; i < args_size; ++i) {
                            extra_args[i] = PyTuple_GET_ITEM(args_in, args_copied + i);
                        }
                    }
                    call.args.push_back(extra_args);
                    call.args_convert.push_back(false);
                    call.args_ref = std::move(extra_args);
                }

                // 4b. If we have a py::kwargs, pass on any remaining kwargs
                if (func.has_kwargs) {
                    if (!kwargs.ptr())
                        kwargs = dict(); // If we didn't get one, send an empty one
                    call.args.push_back(kwargs);
                    call.args_convert.push_back(false);
                    call.kwargs_ref = std::move(kwargs);
                }

                // 5. Put everything in a vector.  Not technically step 5, we've been building it
                // in `call.args` all along.
                #if !defined(NDEBUG)
                if (call.args.size() != func.nargs || call.args_convert.size() != func.nargs)
                    pybind11_fail("Internal error: function call dispatcher inserted wrong number of arguments!");
                #endif

                std::vector<bool> second_pass_convert;
                if (overloaded) {
                    // We're in the first no-convert pass, so swap out the conversion flags for a
                    // set of all-false flags.  If the call fails, we'll swap the flags back in for
                    // the conversion-allowed call below.
                    second_pass_convert.resize(func.nargs, false);
                    call.args_convert.swap(second_pass_convert);
                }

                // 6. Call the function.
                try {
                    loader_life_support guard{};
                    result = func.impl(call);
                } catch (reference_cast_error &) {
                    result = PYBIND11_TRY_NEXT_OVERLOAD;
                }

                if (result.ptr() != PYBIND11_TRY_NEXT_OVERLOAD)
                    break;

                if (overloaded) {
                    // The (overloaded) call failed; if the call has at least one argument that
                    // permits conversion (i.e. it hasn't been explicitly specified `.noconvert()`)
                    // then add this call to the list of second pass overloads to try.
                    for (size_t i = func.is_method ? 1 : 0; i < pos_args; i++) {
                        if (second_pass_convert[i]) {
                            // Found one: swap the converting flags back in and store the call for
                            // the second pass.
                            call.args_convert.swap(second_pass_convert);
                            second_pass.push_back(std::move(call));
                            break;
                        }
                    }
                }
            }

            if (overloaded && !second_pass.empty() && result.ptr() == PYBIND11_TRY_NEXT_OVERLOAD) {
                // The no-conversion pass finished without success, try again with conversion allowed
                for (auto &call : second_pass) {
                    try {
                        loader_life_support guard{};
                        result = call.func.impl(call);
                    } catch (reference_cast_error &) {
                        result = PYBIND11_TRY_NEXT_OVERLOAD;
                    }

                    if (result.ptr() != PYBIND11_TRY_NEXT_OVERLOAD) {
                        // The error reporting logic below expects 'it' to be valid, as it would be
                        // if we'd encountered this failure in the first-pass loop.
                        if (!result)
                            it = &call.func;
                        break;
                    }
                }
            }
        } catch (error_already_set &e) {
            e.restore();
            return nullptr;
#if defined(__GNUG__) && !defined(__clang__)
        } catch ( abi::__forced_unwind& ) {
            throw;
#endif
        } catch (...) {
            /* When an exception is caught, give each registered exception
               translator a chance to translate it to a Python exception
               in reverse order of registration.

               A translator may choose to do one of the following:

                - catch the exception and call PyErr_SetString or PyErr_SetObject
                  to set a standard (or custom) Python exception, or
                - do nothing and let the exception fall through to the next translator, or
                - delegate translation to the next translator by throwing a new type of exception. */

            auto last_exception = std::current_exception();
            auto &registered_exception_translators = get_internals().registered_exception_translators;
            for (auto& translator : registered_exception_translators) {
                try {
                    translator(last_exception);
                } catch (...) {
                    last_exception = std::current_exception();
                    continue;
                }
                return nullptr;
            }
            PyErr_SetString(PyExc_SystemError, "Exception escaped from default exception translator!");
            return nullptr;
        }

        auto append_note_if_missing_header_is_suspected = [](std::string &msg) {
            if (msg.find("std::") != std::string::npos) {
                msg += "\n\n"
                       "Did you forget to `#include <pybind11/stl.h>`? Or <pybind11/complex.h>,\n"
                       "<pybind11/functional.h>, <pybind11/chrono.h>, etc. Some automatic\n"
                       "conversions are optional and require extra headers to be included\n"
                       "when compiling your pybind11 module.";
            }
        };

        if (result.ptr() == PYBIND11_TRY_NEXT_OVERLOAD) {
            if (overloads->is_operator)
                return handle(Py_NotImplemented).inc_ref().ptr();

            std::string msg = std::string(overloads->name) + "(): incompatible " +
                std::string(overloads->is_constructor ? "constructor" : "function") +
                " arguments. The following argument types are supported:\n";

            int ctr = 0;
            for (const function_record *it2 = overloads; it2 != nullptr; it2 = it2->next) {
                msg += "    "+ std::to_string(++ctr) + ". ";

                bool wrote_sig = false;
                if (overloads->is_constructor) {
                    // For a constructor, rewrite `(self: Object, arg0, ...) -> NoneType` as `Object(arg0, ...)`
                    std::string sig = it2->signature;
                    size_t start = sig.find('(') + 7; // skip "(self: "
                    if (start < sig.size()) {
                        // End at the , for the next argument
                        size_t end = sig.find(", "), next = end + 2;
                        size_t ret = sig.rfind(" -> ");
                        // Or the ), if there is no comma:
                        if (end >= sig.size()) next = end = sig.find(')');
                        if (start < end && next < sig.size()) {
                            msg.append(sig, start, end - start);
                            msg += '(';
                            msg.append(sig, next, ret - next);
                            wrote_sig = true;
                        }
                    }
                }
                if (!wrote_sig) msg += it2->signature;

                msg += "\n";
            }
            msg += "\nInvoked with: ";
            auto args_ = reinterpret_borrow<tuple>(args_in);
            bool some_args = false;
            for (size_t ti = overloads->is_constructor ? 1 : 0; ti < args_.size(); ++ti) {
                if (!some_args) some_args = true;
                else msg += ", ";
                try {
                    msg += pybind11::repr(args_[ti]);
                } catch (const error_already_set&) {
                    msg += "<repr raised Error>";
                }
            }
            if (kwargs_in) {
                auto kwargs = reinterpret_borrow<dict>(kwargs_in);
                if (!kwargs.empty()) {
                    if (some_args) msg += "; ";
                    msg += "kwargs: ";
                    bool first = true;
                    for (auto kwarg : kwargs) {
                        if (first) first = false;
                        else msg += ", ";
                        msg += pybind11::str("{}=").format(kwarg.first);
                        try {
                            msg += pybind11::repr(kwarg.second);
                        } catch (const error_already_set&) {
                            msg += "<repr raised Error>";
                        }
                    }
                }
            }

            append_note_if_missing_header_is_suspected(msg);
            PyErr_SetString(PyExc_TypeError, msg.c_str());
            return nullptr;
        } else if (!result) {
            std::string msg = "Unable to convert function return value to a "
                              "Python type! The signature was\n\t";
            msg += it->signature;
            append_note_if_missing_header_is_suspected(msg);
            PyErr_SetString(PyExc_TypeError, msg.c_str());
            return nullptr;
        } else {
            if (overloads->is_constructor && !self_value_and_holder.holder_constructed()) {
                auto *pi = reinterpret_cast<instance *>(parent.ptr());
                self_value_and_holder.type->init_instance(pi, nullptr);
            }
            return result.ptr();
        }
    }